

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O1

bool __thiscall
google::protobuf::compiler::Parser::ParseUninterpretedBlock(Parser *this,string *value)

{
  pointer __s1;
  bool bVar1;
  int iVar2;
  size_type __rlen;
  Tokenizer *this_00;
  string_view text;
  int local_34;
  
  text._M_str = "{";
  text._M_len = 1;
  bVar1 = Consume(this,text);
  if (bVar1) {
    this_00 = this->input_;
    bVar1 = (this_00->current_).type != TYPE_END;
    if (bVar1) {
      local_34 = 1;
      do {
        if ((this_00->current_).text._M_string_length == 1) {
          __s1 = (this_00->current_).text._M_dataplus._M_p;
          iVar2 = bcmp(__s1,"{",1);
          if (iVar2 == 0) {
            local_34 = local_34 + 1;
          }
          else {
            iVar2 = bcmp(__s1,"}",1);
            if ((iVar2 == 0) && (local_34 = local_34 + -1, local_34 == 0)) {
              io::Tokenizer::Next(this_00);
              return bVar1;
            }
          }
        }
        if (value->_M_string_length != 0) {
          std::__cxx11::string::push_back((char)value);
        }
        std::__cxx11::string::_M_append
                  ((char *)value,(ulong)(this->input_->current_).text._M_dataplus._M_p);
        io::Tokenizer::Next(this->input_);
        this_00 = this->input_;
        bVar1 = (this_00->current_).type != TYPE_END;
      } while (bVar1);
    }
    RecordError(this,(ErrorMaker)ZEXT816(0x3e90d8));
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool Parser::ParseUninterpretedBlock(std::string* value) {
  // Note that enclosing braces are not added to *value.
  // We do NOT use ConsumeEndOfStatement for this brace because it's delimiting
  // an expression, not a block of statements.
  DO(Consume("{"));
  int brace_depth = 1;
  while (!AtEnd()) {
    if (LookingAt("{")) {
      brace_depth++;
    } else if (LookingAt("}")) {
      brace_depth--;
      if (brace_depth == 0) {
        input_->Next();
        return true;
      }
    }
    // TODO: Interpret line/column numbers to preserve formatting
    if (!value->empty()) value->push_back(' ');
    value->append(input_->current().text);
    input_->Next();
  }
  RecordError("Unexpected end of stream while parsing aggregate value.");
  return false;
}